

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StaticAnalyser.cpp
# Opt level: O0

TargetList *
Analyser::Static::ZX8081::GetTargets
          (TargetList *__return_storage_ptr__,Media *media,string *param_2,
          IntType potential_platforms)

{
  bool bVar1;
  const_reference tape;
  __shared_ptr_access<Storage::Tape::Tape,_(__gnu_cxx::_Lock_policy)2,_false,_false> *this;
  element_type *this_00;
  Target *this_01;
  reference pvVar2;
  size_type sVar3;
  unique_ptr<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>_> local_60;
  Target *local_58;
  Target *target;
  undefined1 local_40 [8];
  vector<Storage::Data::ZX8081::File,_std::allocator<Storage::Data::ZX8081::File>_> files;
  IntType potential_platforms_local;
  string *param_1_local;
  Media *media_local;
  TargetList *destination;
  
  files.
  super__Vector_base<Storage::Data::ZX8081::File,_std::allocator<Storage::Data::ZX8081::File>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage._3_1_ = 0;
  files.
  super__Vector_base<Storage::Data::ZX8081::File,_std::allocator<Storage::Data::ZX8081::File>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = potential_platforms;
  std::
  vector<std::unique_ptr<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>_>,_std::allocator<std::unique_ptr<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>_>_>_>
  ::vector(__return_storage_ptr__);
  bVar1 = std::
          vector<std::shared_ptr<Storage::Tape::Tape>,_std::allocator<std::shared_ptr<Storage::Tape::Tape>_>_>
          ::empty(&media->tapes);
  if (!bVar1) {
    tape = std::
           vector<std::shared_ptr<Storage::Tape::Tape>,_std::allocator<std::shared_ptr<Storage::Tape::Tape>_>_>
           ::front(&media->tapes);
    GetFiles((vector<Storage::Data::ZX8081::File,_std::allocator<Storage::Data::ZX8081::File>_> *)
             local_40,tape);
    this = (__shared_ptr_access<Storage::Tape::Tape,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
           std::
           vector<std::shared_ptr<Storage::Tape::Tape>,_std::allocator<std::shared_ptr<Storage::Tape::Tape>_>_>
           ::front(&media->tapes);
    this_00 = std::
              __shared_ptr_access<Storage::Tape::Tape,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->(this);
    Storage::Tape::Tape::reset(this_00);
    bVar1 = std::vector<Storage::Data::ZX8081::File,_std::allocator<Storage::Data::ZX8081::File>_>::
            empty((vector<Storage::Data::ZX8081::File,_std::allocator<Storage::Data::ZX8081::File>_>
                   *)local_40);
    if (!bVar1) {
      this_01 = (Target *)operator_new(0xb0);
      Target::Target(this_01);
      local_58 = this_01;
      std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>::
      unique_ptr<std::default_delete<Analyser::Static::Target>,void>
                ((unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>
                  *)&local_60,(pointer)this_01);
      std::
      vector<std::unique_ptr<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>_>,_std::allocator<std::unique_ptr<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>_>_>_>
      ::push_back(__return_storage_ptr__,(value_type *)&local_60);
      std::unique_ptr<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>_>::
      ~unique_ptr(&local_60);
      (local_58->super_Target).machine = ZX8081;
      if ((files.
           super__Vector_base<Storage::Data::ZX8081::File,_std::allocator<Storage::Data::ZX8081::File>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ & 0x180000) == 0x80000) {
        local_58->is_ZX81 = false;
      }
      else if ((files.
                super__Vector_base<Storage::Data::ZX8081::File,_std::allocator<Storage::Data::ZX8081::File>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ & 0x180000) == 0x100000) {
        local_58->is_ZX81 = true;
      }
      else {
        pvVar2 = std::
                 vector<Storage::Data::ZX8081::File,_std::allocator<Storage::Data::ZX8081::File>_>::
                 front((vector<Storage::Data::ZX8081::File,_std::allocator<Storage::Data::ZX8081::File>_>
                        *)local_40);
        local_58->is_ZX81 = (bool)(pvVar2->isZX81 & 1);
      }
      pvVar2 = std::
               vector<Storage::Data::ZX8081::File,_std::allocator<Storage::Data::ZX8081::File>_>::
               front((vector<Storage::Data::ZX8081::File,_std::allocator<Storage::Data::ZX8081::File>_>
                      *)local_40);
      sVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&pvVar2->data);
      if (sVar3 < 0x401) {
        local_58->memory_model = Unexpanded;
      }
      else {
        local_58->memory_model = SixteenKB;
      }
      std::
      vector<std::shared_ptr<Storage::Tape::Tape>,_std::allocator<std::shared_ptr<Storage::Tape::Tape>_>_>
      ::operator=(&(local_58->super_Target).media.tapes,&media->tapes);
      if ((local_58->is_ZX81 & 1U) == 0) {
        std::__cxx11::string::operator=((string *)&local_58->loading_command,"W\n");
      }
      else {
        std::__cxx11::string::operator=((string *)&local_58->loading_command,"J\"\"\n");
      }
    }
    std::vector<Storage::Data::ZX8081::File,_std::allocator<Storage::Data::ZX8081::File>_>::~vector
              ((vector<Storage::Data::ZX8081::File,_std::allocator<Storage::Data::ZX8081::File>_> *)
               local_40);
  }
  return __return_storage_ptr__;
}

Assistant:

Analyser::Static::TargetList Analyser::Static::ZX8081::GetTargets(const Media &media, const std::string &, TargetPlatform::IntType potential_platforms) {
	TargetList destination;
	if(!media.tapes.empty()) {
		std::vector<Storage::Data::ZX8081::File> files = GetFiles(media.tapes.front());
		media.tapes.front()->reset();
		if(!files.empty()) {
			Target *const target = new Target;
			destination.push_back(std::unique_ptr<::Analyser::Static::Target>(target));
			target->machine = Machine::ZX8081;

			// Guess the machine type from the file only if it isn't already known.
			switch(potential_platforms & (TargetPlatform::ZX80 | TargetPlatform::ZX81)) {
				default:
					target->is_ZX81 = files.front().isZX81;
				break;

				case TargetPlatform::ZX80:	target->is_ZX81 = false;	break;
				case TargetPlatform::ZX81:	target->is_ZX81 = true;		break;
			}

			/*if(files.front().data.size() > 16384) {
				target->zx8081.memory_model = ZX8081MemoryModel::SixtyFourKB;
			} else*/ if(files.front().data.size() > 1024) {
				target->memory_model = Target::MemoryModel::SixteenKB;
			} else {
				target->memory_model = Target::MemoryModel::Unexpanded;
			}
			target->media.tapes = media.tapes;

			// TODO: how to run software once loaded? Might require a BASIC detokeniser.
			if(target->is_ZX81) {
				target->loading_command = "J\"\"\n";
			} else {
				target->loading_command = "W\n";
			}

		}
	}
	return destination;
}